

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v11::vprintln(FILE *f,string_view fmt,format_args args)

{
  string_view text;
  memory_buffer buffer;
  buffer<char> local_228;
  FILE local_208 [2];
  
  local_228.size_ = 0;
  local_228.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_228.capacity_ = 500;
  local_228.ptr_ = (char *)local_208;
  detail::vformat_to(&local_228,fmt,args,(locale_ref)0x0);
  if (local_228.capacity_ < local_228.size_ + 1) {
    (*local_228.grow_)(&local_228,local_228.size_ + 1);
  }
  *(undefined1 *)((long)(int *)local_228.ptr_ + local_228.size_) = 10;
  text.size_ = local_228.size_;
  text.data_ = (char *)(local_228.size_ + 1);
  local_228.size_ = local_228.size_ + 1;
  detail::print((detail *)f,(FILE *)local_228.ptr_,text);
  if ((FILE *)local_228.ptr_ != local_208) {
    free(local_228.ptr_);
  }
  return;
}

Assistant:

FMT_FUNC void vprintln(std::FILE* f, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  buffer.push_back('\n');
  detail::print(f, {buffer.data(), buffer.size()});
}